

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O0

char * crnlib::get_texture_type_desc(texture_type t)

{
  char *pcStack_10;
  texture_type t_local;
  
  switch(t) {
  case cTextureTypeUnknown:
    pcStack_10 = "Unknown";
    break;
  case cTextureTypeRegularMap:
    pcStack_10 = "2D map";
    break;
  case cTextureTypeNormalMap:
    pcStack_10 = "Normal map";
    break;
  case cTextureTypeVerticalCrossCubemap:
    pcStack_10 = "Vertical Cross Cubemap";
    break;
  case cTextureTypeCubemap:
    pcStack_10 = "Cubemap";
    break;
  default:
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* get_texture_type_desc(texture_type t)
    {
        switch (t)
        {
        case cTextureTypeUnknown:
            return "Unknown";
        case cTextureTypeRegularMap:
            return "2D map";
        case cTextureTypeNormalMap:
            return "Normal map";
        case cTextureTypeVerticalCrossCubemap:
            return "Vertical Cross Cubemap";
        case cTextureTypeCubemap:
            return "Cubemap";
        default:
            break;
        }

        CRNLIB_ASSERT(false);

        return "?";
    }